

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O3

int __thiscall OB::Parg::pipe_stdin(Parg *this)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  undefined8 in_R9;
  
  iVar3 = 0;
  iVar2 = isatty(0);
  if (iVar2 == 0) {
    pcVar1 = (this->stdin_)._M_dataplus._M_p;
    std::__cxx11::string::_M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&this->stdin_,pcVar1,pcVar1 + (this->stdin_)._M_string_length,
               *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x10e2b0),0xffffffff,in_R9,0,0xffffffff
              );
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&this->stdin_,0,(char *)(this->stdin_)._M_string_length,0x1092fe);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int pipe_stdin()
  {
    if (! isatty(STDIN_FILENO))
    {
      stdin_.assign((std::istreambuf_iterator<char>(std::cin)),
        (std::istreambuf_iterator<char>()));
      return 0;
    }
    stdin_ = "";
    return -1;
  }